

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

_Bool mpack_writer_ensure(mpack_writer_t *writer,size_t count)

{
  char *pcVar1;
  char *pcVar2;
  mpack_writer_error_t p_Var3;
  mpack_error_t mVar4;
  
  if (writer->error != mpack_ok) {
    return false;
  }
  if (writer->flush == (mpack_writer_flush_t)0x0) {
    writer->error = mpack_error_too_big;
    p_Var3 = writer->error_fn;
    if (p_Var3 == (mpack_writer_error_t)0x0) {
      return false;
    }
    mVar4 = mpack_error_too_big;
  }
  else {
    pcVar1 = writer->current;
    pcVar2 = writer->buffer;
    writer->current = pcVar2;
    (*writer->flush)(writer,pcVar2,(long)pcVar1 - (long)pcVar2);
    if (writer->error != mpack_ok) {
      return false;
    }
    if (count <= (ulong)((long)writer->end - (long)writer->current)) {
      return true;
    }
    writer->error = mpack_error_io;
    p_Var3 = writer->error_fn;
    if (p_Var3 == (mpack_writer_error_t)0x0) {
      return false;
    }
    mVar4 = mpack_error_io;
  }
  (*p_Var3)(writer,mVar4);
  return false;
}

Assistant:

MPACK_NOINLINE static bool mpack_writer_ensure(mpack_writer_t* writer, size_t count) {
    mpack_assert(count != 0, "cannot ensure zero bytes!");
    mpack_assert(count <= MPACK_WRITER_MINIMUM_BUFFER_SIZE,
            "cannot ensure %i bytes, this is more than the minimum buffer size %i!",
            (int)count, (int)MPACK_WRITER_MINIMUM_BUFFER_SIZE);
    mpack_assert(count > mpack_writer_buffer_left(writer),
            "request to ensure %i bytes but there are already %i left in the buffer!",
            (int)count, (int)mpack_writer_buffer_left(writer));

    mpack_log("ensuring %i bytes, %i left\n", (int)count, (int)mpack_writer_buffer_left(writer));

    if (mpack_writer_error(writer) != mpack_ok)
        return false;

    if (writer->flush == NULL) {
        mpack_writer_flag_error(writer, mpack_error_too_big);
        return false;
    }

    mpack_writer_flush_unchecked(writer);
    if (mpack_writer_error(writer) != mpack_ok)
        return false;

    if (mpack_writer_buffer_left(writer) >= count)
        return true;

    mpack_writer_flag_error(writer, mpack_error_io);
    return false;
}